

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

void __thiscall MidiOutAlsa::MidiOutAlsa(MidiOutAlsa *this,string *clientName)

{
  (this->super_MidiOutApi).super_MidiApi.apiData_ = (void *)0x0;
  (this->super_MidiOutApi).super_MidiApi.connected_ = false;
  (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p =
       (pointer)&(this->super_MidiOutApi).super_MidiApi.errorString_.field_2;
  (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length = 0;
  (this->super_MidiOutApi).super_MidiApi.errorString_.field_2._M_local_buf[0] = '\0';
  (this->super_MidiOutApi).super_MidiApi.errorCallback_ = (RtMidiErrorCallback)0x0;
  (this->super_MidiOutApi).super_MidiApi.firstErrorOccurred_ = false;
  (this->super_MidiOutApi).super_MidiApi.errorCallbackUserData_ = (void *)0x0;
  (this->super_MidiOutApi).super_MidiApi._vptr_MidiApi = (_func_int **)&PTR__MidiOutAlsa_00115c40;
  initialize(this,clientName);
  return;
}

Assistant:

MidiOutAlsa :: MidiOutAlsa( const std::string &clientName ) : MidiOutApi()
{
  MidiOutAlsa::initialize( clientName );
}